

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::~Codec(Codec *this)

{
  FreeWorkspace(this);
  FreeMatrix(this);
  FreeInput(this);
  return;
}

Assistant:

Codec::~Codec()
{
    FreeWorkspace();
    FreeMatrix();
    FreeInput();
}